

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::remap_swizzle
          (CompilerGLSL *this,SPIRType *out_type,uint32_t input_components,string *expr)

{
  uint *puVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  string *in_R8;
  uint local_88;
  uint local_84;
  undefined1 local_80 [4];
  uint32_t c;
  undefined1 local_5d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *expr_local;
  long lStack_20;
  uint32_t input_components_local;
  SPIRType *out_type_local;
  CompilerGLSL *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  
  lStack_20 = CONCAT44(in_register_00000014,input_components);
  expr_local._4_4_ = (int)expr;
  out_type_local = out_type;
  this_local = this;
  if (*(int *)(lStack_20 + 0x18) == expr_local._4_4_) {
    ::std::__cxx11::string::string((string *)this,in_R8);
  }
  else if ((expr_local._4_4_ == 1) &&
          (((uint)out_type[0x17].member_name_cache._M_h._M_rehash_policy._M_max_load_factor & 1) ==
           0)) {
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8;
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(local_50,out_type,lStack_20,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              ((spirv_cross *)this,local_50,(char (*) [2])0x422b6e,local_30,(char (*) [2])0x40bd22);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    local_5d = 0;
    enclose_expression((CompilerGLSL *)local_80,(string *)out_type);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_80);
    ::std::__cxx11::string::~string((string *)local_80);
    for (local_84 = 0; local_84 < *(uint *)(lStack_20 + 0x18); local_84 = local_84 + 1) {
      local_88 = expr_local._4_4_ - 1;
      puVar1 = ::std::min<unsigned_int>(&local_84,&local_88);
      pcVar2 = index_to_swizzle((CompilerGLSL *)out_type,*puVar1);
      ::std::__cxx11::string::operator+=((string *)this,pcVar2);
    }
    if ((((ulong)out_type[0x17].member_name_cache._M_h._M_before_begin._M_nxt & 0x100000000) != 0)
       && (1 < *(uint *)(lStack_20 + 0x18))) {
      ::std::__cxx11::string::operator+=((string *)this,"()");
    }
    remove_duplicate_swizzle((CompilerGLSL *)out_type,(string *)this);
  }
  return this;
}

Assistant:

string CompilerGLSL::remap_swizzle(const SPIRType &out_type, uint32_t input_components, const string &expr)
{
	if (out_type.vecsize == input_components)
		return expr;
	else if (input_components == 1 && !backend.can_swizzle_scalar)
		return join(type_to_glsl(out_type), "(", expr, ")");
	else
	{
		// FIXME: This will not work with packed expressions.
		auto e = enclose_expression(expr) + ".";
		// Just clamp the swizzle index if we have more outputs than inputs.
		for (uint32_t c = 0; c < out_type.vecsize; c++)
			e += index_to_swizzle(min(c, input_components - 1));
		if (backend.swizzle_is_function && out_type.vecsize > 1)
			e += "()";

		remove_duplicate_swizzle(e);
		return e;
	}
}